

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.cpp
# Opt level: O1

bool __thiscall boost::thread::start_thread_noexcept(thread *this)

{
  element_type *peVar1;
  int iVar2;
  shared_count asStack_20 [2];
  
  peVar1 = (this->thread_info).px;
  if (peVar1 != (element_type *)0x0) {
    shared_ptr<boost::detail::thread_data_base>::operator=(&peVar1->self,&this->thread_info);
    peVar1 = (this->thread_info).px;
    if (peVar1 != (element_type *)0x0) {
      iVar2 = pthread_create(&peVar1->thread_handle,(pthread_attr_t *)0x0,
                             (anonymous_namespace)::thread_proxy,peVar1);
      if (iVar2 != 0) {
        peVar1 = (this->thread_info).px;
        if (peVar1 == (element_type *)0x0) goto LAB_0019bec9;
        asStack_20[0].pi_ = (peVar1->self).pn.pi_;
        (peVar1->self).px = (element_type *)0x0;
        (peVar1->self).pn.pi_ = (sp_counted_base *)0x0;
        detail::shared_count::~shared_count(asStack_20);
      }
      return iVar2 == 0;
    }
  }
LAB_0019bec9:
  __assert_fail("px != 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Sleeplessy[P]ccel/third_party/boost/boost/smart_ptr/shared_ptr.hpp"
                ,0x2de,
                "typename boost::detail::sp_member_access<T>::type boost::shared_ptr<boost::detail::thread_data_base>::operator->() const [T = boost::detail::thread_data_base]"
               );
}

Assistant:

bool thread::start_thread_noexcept()
    {
        thread_info->self=thread_info;
        int const res = pthread_create(&thread_info->thread_handle, 0, &thread_proxy, thread_info.get());
        if (res != 0)
        {
            thread_info->self.reset();
            return false;
        }
        return true;
    }